

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

Error llvm::DWARFDebugLoclists::visitLocationList
                (DWARFDataExtractor *Data,uint64_t *Offset,uint16_t Version,
                function_ref<bool_(const_llvm::DWARFDebugLoclists::Entry_&)> F)

{
  bool bVar1;
  byte bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  char *Fmt;
  uint64_t uVar5;
  undefined6 in_register_00000012;
  ulong uVar6;
  undefined8 in_R9;
  error_code EC;
  byte local_98 [8];
  Entry E;
  Error local_58;
  DWARFDataExtractor *local_50;
  undefined1 local_48 [8];
  Cursor C;
  
  C.Err.Payload._4_4_ = F.callback._0_4_;
  local_48 = *(undefined1 (*) [8])CONCAT62(in_register_00000012,Version);
  C.Offset = 1;
  bVar2 = 1;
  local_50 = Data;
  do {
    if (bVar2 == 0) {
      *(undefined1 (*) [8])CONCAT62(in_register_00000012,Version) = local_48;
      (local_50->super_DataExtractor).Data.Data = (char *)0x1;
      break;
    }
    E.Value1 = (uint64_t)
               &E.Loc.super_SmallVectorImpl<unsigned_char>.
                super_SmallVectorTemplateBase<unsigned_char,_true>.
                super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    E.Loc.super_SmallVectorImpl<unsigned_char>.super_SmallVectorTemplateBase<unsigned_char,_true>.
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
         (void *)0x400000000;
    E._0_8_ = local_48;
    local_98[0] = DataExtractor::getU8((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C);
    switch(local_98[0]) {
    case 0:
      break;
    case 1:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C)
      ;
      break;
    default:
      local_58.Payload = (ErrorInfoBase *)(C.Offset | 1);
      C.Offset = 0;
      cantFail(&local_58,(char *)0x0);
      if ((long *)((ulong)local_58.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_58.Payload & 0xfffffffffffffffe) + 8))();
      }
      Fmt = (char *)std::_V2::generic_category();
      E.Loc._20_4_ = ZEXT14(local_98[0]);
      EC._M_cat = (error_category *)0x54;
      EC._0_8_ = local_50;
      createStringError<int>(EC,Fmt,(int *)"LLE of kind %x not supported");
      goto LAB_00d80c03;
    case 3:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C)
      ;
      if (C.Err.Payload._4_2_ < 5) {
        uVar4 = DataExtractor::getU32((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C);
        E.Value0 = (uint64_t)uVar4;
      }
      else {
        E.Value0 = DataExtractor::getULEB128
                             ((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C);
      }
      break;
    case 4:
      E.Offset = DataExtractor::getULEB128((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C)
      ;
      E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C)
      ;
      break;
    case 6:
      E.Offset = DWARFDataExtractor::getRelocatedValue
                           ((DWARFDataExtractor *)Offset,(uint)*(byte *)((long)Offset + 0x11),
                            (uint64_t *)local_48,(uint64_t *)0x0,(Error *)&C);
      break;
    case 8:
      E.Offset = DWARFDataExtractor::getRelocatedValue
                           ((DWARFDataExtractor *)Offset,(uint)*(byte *)((long)Offset + 0x11),
                            (uint64_t *)local_48,(uint64_t *)0x0,(Error *)&C);
      E.Value0 = DataExtractor::getULEB128((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C)
      ;
    }
    if ((6 < local_98[0]) || ((0x43U >> (local_98[0] & 0x1f) & 1) == 0)) {
      if (C.Err.Payload._4_2_ < 5) {
        uVar3 = DataExtractor::getU16((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C);
        uVar4 = (uint32_t)uVar3;
      }
      else {
        uVar5 = DataExtractor::getULEB128((DataExtractor *)Offset,(uint64_t *)local_48,(Error *)&C);
        uVar4 = (uint32_t)uVar5;
      }
      DataExtractor::getU8
                ((DataExtractor *)Offset,(Cursor *)local_48,
                 (SmallVectorImpl<unsigned_char> *)&E.Value1,uVar4);
    }
    uVar6 = C.Offset & 0xfffffffffffffffe;
    if (uVar6 == 0) {
      C.Offset = uVar6 != 0 | uVar6;
      bVar2 = (*(code *)F.callable)(in_R9,local_98);
      bVar2 = bVar2 & local_98[0] != 0;
      bVar1 = true;
    }
    else {
      (local_50->super_DataExtractor).Data.Data = (char *)(C.Offset | 1);
      C.Offset = 0;
LAB_00d80c03:
      bVar1 = false;
    }
    if ((uint *)E.Value1 !=
        &E.Loc.super_SmallVectorImpl<unsigned_char>.
         super_SmallVectorTemplateBase<unsigned_char,_true>.
         super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size) {
      free((void *)E.Value1);
    }
  } while (bVar1);
  if ((long *)(C.Offset & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(C.Offset & 0xfffffffffffffffe) + 8))();
  }
  return (Error)(ErrorInfoBase *)local_50;
}

Assistant:

Error DWARFDebugLoclists::visitLocationList(
    const DWARFDataExtractor &Data, uint64_t *Offset, uint16_t Version,
    llvm::function_ref<bool(const Entry &)> F) {

  DataExtractor::Cursor C(*Offset);
  bool Continue = true;
  while (Continue) {
    Entry E;
    E.Offset = C.tell();
    E.Kind = Data.getU8(C);
    switch (E.Kind) {
    case dwarf::DW_LLE_end_of_list:
      break;
    case dwarf::DW_LLE_base_addressx:
      E.Value0 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_startx_length:
      E.Value0 = Data.getULEB128(C);
      // Pre-DWARF 5 has different interpretation of the length field. We have
      // to support both pre- and standartized styles for the compatibility.
      if (Version < 5)
        E.Value1 = Data.getU32(C);
      else
        E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_offset_pair:
      E.Value0 = Data.getULEB128(C);
      E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_base_address:
      E.Value0 = Data.getRelocatedAddress(C);
      break;
    case dwarf::DW_LLE_start_length:
      E.Value0 = Data.getRelocatedAddress(C);
      E.Value1 = Data.getULEB128(C);
      break;
    case dwarf::DW_LLE_startx_endx:
    case dwarf::DW_LLE_default_location:
    case dwarf::DW_LLE_start_end:
    default:
      cantFail(C.takeError());
      return createStringError(errc::illegal_byte_sequence,
                               "LLE of kind %x not supported", (int)E.Kind);
    }

    if (E.Kind != dwarf::DW_LLE_base_address &&
        E.Kind != dwarf::DW_LLE_base_addressx &&
        E.Kind != dwarf::DW_LLE_end_of_list) {
      unsigned Bytes = Version >= 5 ? Data.getULEB128(C) : Data.getU16(C);
      // A single location description describing the location of the object...
      Data.getU8(C, E.Loc, Bytes);
    }

    if (!C)
      return C.takeError();
    Continue = F(E) && E.Kind != dwarf::DW_LLE_end_of_list;
  }
  *Offset = C.tell();
  return Error::success();
}